

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ImageOperation function)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "imageStore";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "imageLoad";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "imageAtomicAdd";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "imageAtomicMin";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "imageAtomicMax";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "imageAtomicAnd";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "imageAtomicOr";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "imageAtomicXor";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "imageAtomicExchange";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "imageAtomicCompSwap";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getFunctionName (ImageOperation function)
{
	switch (function)
	{
		case IMAGE_OPERATION_STORE:				return std::string("imageStore");
		case IMAGE_OPERATION_LOAD:				return std::string("imageLoad");
		case IMAGE_OPERATION_ATOMIC_ADD:		return std::string("imageAtomicAdd");
		case IMAGE_OPERATION_ATOMIC_MIN:		return std::string("imageAtomicMin");
		case IMAGE_OPERATION_ATOMIC_MAX:		return std::string("imageAtomicMax");
		case IMAGE_OPERATION_ATOMIC_AND:		return std::string("imageAtomicAnd");
		case IMAGE_OPERATION_ATOMIC_OR:			return std::string("imageAtomicOr");
		case IMAGE_OPERATION_ATOMIC_XOR:		return std::string("imageAtomicXor");
		case IMAGE_OPERATION_ATOMIC_EXCHANGE:	return std::string("imageAtomicExchange");
		case IMAGE_OPERATION_ATOMIC_COMP_SWAP:	return std::string("imageAtomicCompSwap");
		default:
			DE_ASSERT(DE_FALSE);
	}
	return std::string("");
}